

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O0

void __thiscall
neural_networks::utilities::NeuralLayer::NeuralLayer
          (NeuralLayer *this,NeuralLayer *input,size_t layer_size,string *label)

{
  NeuralMatrix *this_00;
  Matrix<long_double> *pMVar1;
  bad_alloc *error;
  string *label_local;
  size_t layer_size_local;
  NeuralLayer *input_local;
  NeuralLayer *this_local;
  
  this->_vptr_NeuralLayer = (_func_int **)&PTR_update_00119bb8;
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  this->N = layer_size;
  this->input = input;
  this_00 = (NeuralMatrix *)operator_new(0x30);
  NeuralMatrix::NeuralMatrix(this_00,this->N,1,false,false);
  this->data = this_00;
  pMVar1 = matrix_operators::create_randomized_matrix
                     (this->N,input->N,(longdouble)0,(longdouble)2.0);
  this->weights = pMVar1;
  pMVar1 = matrix_operators::create_randomized_matrix(this->N,1,(longdouble)0,(longdouble)2.0);
  this->bias = pMVar1;
  return;
}

Assistant:

neural_networks::utilities::NeuralLayer::NeuralLayer(
        const neural_networks::utilities::NeuralLayer *input,
        const size_t layer_size,
        std::string label
) : input(input), N(layer_size), label(label) {
    try {
        data = new NeuralMatrix(N);
        weights = matrix_operators::create_randomized_matrix(N, input -> N);
        bias = matrix_operators::create_randomized_matrix(N);
    } catch (std::bad_alloc& error) {
        std::cerr << "NeuralLayer object at <" << this << "> failed to allocate memory.\n";
        delete data;
        delete weights;
        delete bias;
    }
}